

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.c
# Opt level: O0

int main(void)

{
  size_t thread_count_00;
  thread_pool *thread_pool_00;
  undefined1 local_e0 [8];
  timespec t_end;
  parallel_task_2d local_b0;
  size_t *local_80;
  undefined1 local_78 [8];
  timespec t_start;
  char *output_file;
  thread_pool *thread_pool;
  size_t thread_count;
  global_data global_data;
  int n;
  int m;
  
  global_data.pixels._4_4_ = 2000;
  thread_count = 0xc002000000000000;
  global_data.x_min = 1.25;
  global_data.x_max = -1.75;
  global_data.y_min = 1.75;
  global_data.y_max._0_4_ = 2000;
  global_data.y_max._4_4_ = 2000;
  global_data.count_max = 2000;
  global_data._40_8_ = malloc(16000000);
  thread_count_00 = detect_system_thread_count();
  thread_pool_00 = new_thread_pool(thread_count_00);
  t_start.tv_nsec = (__syscall_slong_t)anon_var_dwarf_23;
  printf("Thread pool with %zu thread(s) created\n",thread_count_00);
  timespec_get(local_78);
  memset(&local_b0,0,0x38);
  local_80 = &thread_count;
  t_end.tv_nsec = 0;
  parallel_for_2d(thread_pool_00,render_task,&local_b0,0x38,(range *)&t_end.tv_nsec);
  timespec_get(local_e0,1);
  free_thread_pool(thread_pool_00);
  elapsed_seconds((timespec *)local_78,(timespec *)local_e0);
  printf("Rendering took %g seconds\n");
  write_ppm((char *)t_start.tv_nsec,(uint32_t *)global_data._40_8_,global_data.pixels._4_4_,2000);
  printf("Image written to \"%s\"\n",t_start.tv_nsec);
  free((void *)global_data._40_8_);
  return 0;
}

Assistant:

int main() {
    int m = 2000;
    int n = 2000;

    struct global_data global_data = {
        .x_max =   1.25,
        .x_min = - 2.25,
        .y_max =   1.75,
        .y_min = - 1.75,
        .count_max = 2000,
        .n = n,
        .m = m,
        .pixels = malloc(n * m * sizeof(uint32_t))
    };

#ifdef USE_OPENMP
    const char* output_file = "mandelbrot_omp.ppm";
#else
    size_t thread_count = detect_system_thread_count();
    struct thread_pool* thread_pool = new_thread_pool(thread_count);
    const char* output_file = "mandelbrot.ppm";
    printf("Thread pool with %zu thread(s) created\n", thread_count);
#endif

    struct timespec t_start;
    timespec_get(&t_start, TIME_UTC);
#ifdef USE_OPENMP
    render_tile(&(struct tile) {
        .i = 0, .j = 0, .n = n, .m = m
    }, &global_data);
#else
    parallel_for_2d(
        thread_pool,
        render_task,
        (struct parallel_task_2d*)&(struct render_task) { .global_data = &global_data },
        sizeof(struct render_task),
        (struct range[2]) { {0, n}, {0, m} });
#endif
    struct timespec t_end;
    timespec_get(&t_end, TIME_UTC);

#ifndef USE_OPENMP
    free_thread_pool(thread_pool);
#endif
    printf("Rendering took %g seconds\n", elapsed_seconds(&t_start, &t_end));

    write_ppm(output_file, global_data.pixels, n, m);
    printf("Image written to \"%s\"\n", output_file);

    free(global_data.pixels);
    return 0;
}